

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O1

int Cudd_addRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,DdNode ***xn,
                DdNode ***yn_,int *nx,int *ny,int *m,int *n,int bx,int sx,int by,int sy)

{
  uint uVar1;
  int *piVar2;
  DdNode *T;
  bool bVar3;
  DdNode *pDVar4;
  int iVar5;
  DdNode **ppDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode **ppDVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  DdNode *pDVar13;
  FILE *pFVar14;
  ulong uVar15;
  double val;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  DdNode **local_80;
  DdNode **local_78;
  DdNode *local_70;
  DdNode *local_68;
  DdNode *local_60;
  FILE *local_58;
  DdNode **local_50;
  double local_48;
  long local_40;
  long local_38;
  
  T = dd->one;
  pDVar13 = dd->zero;
  local_58 = (FILE *)fp;
  local_50 = E;
  iVar5 = __isoc99_fscanf(fp,"%d %d",&local_94,&local_98);
  if (iVar5 != 2) {
    return 0;
  }
  *m = local_94;
  local_78 = *x;
  ppDVar6 = *xn;
  uVar1 = local_94 - 1;
  uVar10 = 0;
  bVar3 = 1 < (int)local_94;
  local_94 = uVar1;
  if (bVar3) {
    uVar10 = 0;
    do {
      local_94 = uVar1 >> 1;
      uVar10 = uVar10 + 1;
      bVar3 = 1 < uVar1;
      uVar1 = local_94;
    } while (bVar3);
  }
  if (*nx < (int)uVar10) {
    sVar11 = (ulong)uVar10 * 8;
    local_80 = (DdNode **)y;
    if (local_78 == (DdNode **)0x0) {
      local_78 = (DdNode **)malloc(sVar11);
    }
    else {
      local_78 = (DdNode **)realloc(local_78,sVar11);
    }
    *x = local_78;
    if (local_78 == (DdNode **)0x0) goto LAB_0078b291;
    sVar11 = (ulong)uVar10 << 3;
    if (*xn == (DdNode **)0x0) {
      ppDVar6 = (DdNode **)malloc(sVar11);
    }
    else {
      ppDVar6 = (DdNode **)realloc(*xn,sVar11);
    }
    *xn = ppDVar6;
    y = (DdNode ***)local_80;
    if (ppDVar6 == (DdNode **)0x0) goto LAB_0078b291;
  }
  *n = local_98;
  local_70 = (DdNode *)*y;
  local_68 = (DdNode *)*yn_;
  uVar1 = local_98 - 1;
  local_90 = 0;
  bVar3 = 1 < (int)local_98;
  local_98 = uVar1;
  if (bVar3) {
    local_90 = 0;
    do {
      local_98 = uVar1 >> 1;
      local_90 = local_90 + 1;
      bVar3 = 1 < uVar1;
      uVar1 = local_98;
    } while (bVar3);
  }
  local_8c = uVar10;
  if (*ny < (int)local_90) {
    uVar15 = (ulong)local_90;
    sVar11 = uVar15 * 8;
    if (local_70 == (DdNode *)0x0) {
      local_70 = (DdNode *)malloc(sVar11);
    }
    else {
      local_70 = (DdNode *)realloc(local_70,sVar11);
    }
    *y = (DdNode **)local_70;
    if (local_70 != (DdNode *)0x0) {
      sVar11 = uVar15 << 3;
      if (*yn_ == (DdNode **)0x0) {
        local_68 = (DdNode *)malloc(sVar11);
      }
      else {
        local_68 = (DdNode *)realloc(*yn_,sVar11);
      }
      *yn_ = (DdNode **)local_68;
      if (local_68 != (DdNode *)0x0) goto LAB_0078aeba;
    }
LAB_0078b291:
    dd->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
LAB_0078aeba:
  iVar5 = *nx;
  lVar12 = (long)iVar5;
  if (iVar5 < (int)local_8c) {
    iVar5 = iVar5 * sx + bx;
    local_88 = (ulong)(int)local_8c;
    local_80 = ppDVar6;
    ppDVar9 = local_78;
    do {
      do {
        dd->reordered = 0;
        pDVar7 = cuddUniqueInter(dd,iVar5,T,pDVar13);
        ppDVar6 = local_80;
        ppDVar9[lVar12] = pDVar7;
      } while (dd->reordered == 1);
      if (pDVar7 == (DdNode *)0x0) {
        return 0;
      }
      piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      do {
        dd->reordered = 0;
        pDVar7 = cuddUniqueInter(dd,iVar5,pDVar13,T);
        ppDVar6[lVar12] = pDVar7;
      } while (dd->reordered == 1);
      if (pDVar7 == (DdNode *)0x0) {
        return 0;
      }
      piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      lVar12 = lVar12 + 1;
      iVar5 = iVar5 + sx;
      ppDVar9 = local_78;
    } while (lVar12 != local_88);
  }
  iVar5 = *ny;
  lVar12 = (long)iVar5;
  if (iVar5 < (int)local_90) {
    iVar5 = iVar5 * sy + by;
    local_88 = (ulong)(int)local_90;
    local_80 = ppDVar6;
    pDVar7 = local_70;
    do {
      do {
        dd->reordered = 0;
        pDVar8 = cuddUniqueInter(dd,iVar5,T,pDVar13);
        pDVar4 = local_68;
        *(DdNode **)(&pDVar7->index + lVar12 * 2) = pDVar8;
      } while (dd->reordered == 1);
      if (pDVar8 == (DdNode *)0x0) {
        return 0;
      }
      piVar2 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      do {
        dd->reordered = 0;
        pDVar7 = cuddUniqueInter(dd,iVar5,pDVar13,T);
        *(DdNode **)(&pDVar4->index + lVar12 * 2) = pDVar7;
      } while (dd->reordered == 1);
      if (pDVar7 == (DdNode *)0x0) {
        return 0;
      }
      piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + 1;
      lVar12 = lVar12 + 1;
      iVar5 = iVar5 + sy;
      ppDVar6 = local_80;
      pDVar7 = local_70;
    } while (lVar12 != local_88);
  }
  pFVar14 = local_58;
  uVar10 = local_8c;
  uVar1 = local_90;
  *nx = local_8c;
  *ny = local_90;
  pDVar13 = dd->background;
  *local_50 = pDVar13;
  piVar2 = (int *)(((ulong)pDVar13 & 0xfffffffffffffffe) + 4);
  *piVar2 = *piVar2 + 1;
  iVar5 = feof(local_58);
  if (iVar5 != 0) {
    return 1;
  }
  local_88 = (ulong)T & 0xfffffffffffffffe;
  local_40 = (ulong)uVar10 + 1;
  local_38 = (ulong)uVar1 + 1;
  while( true ) {
    lVar12 = local_40;
    iVar5 = __isoc99_fscanf(pFVar14,"%d %d %lf",&local_94,&local_98,&local_48);
    if (iVar5 != 3) {
      if (iVar5 != -1) {
        return 0;
      }
      return 1;
    }
    if (*m <= (int)local_94) {
      return 0;
    }
    if (*n <= (int)local_98) {
      return 0;
    }
    if ((int)(local_98 | local_94) < 0) {
      return 0;
    }
    *(int *)(local_88 + 4) = *(int *)(local_88 + 4) + 1;
    pDVar13 = T;
    pDVar7 = T;
    if (0 < (int)local_8c) {
      do {
        ppDVar9 = local_78;
        if ((local_94 & 1) == 0) {
          ppDVar9 = ppDVar6;
        }
        pDVar7 = Cudd_addApply(dd,Cudd_addTimes,pDVar13,ppDVar9[lVar12 + -2]);
        if (pDVar7 == (DdNode *)0x0) goto LAB_0078b2bc;
        piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        Cudd_RecursiveDeref(dd,pDVar13);
        local_94 = (int)local_94 >> 1;
        lVar12 = lVar12 + -1;
        pDVar13 = pDVar7;
      } while (1 < lVar12);
    }
    lVar12 = local_38;
    pDVar13 = pDVar7;
    if (0 < (int)local_90) {
      do {
        pDVar7 = local_70;
        if ((local_98 & 1) == 0) {
          pDVar7 = local_68;
        }
        pDVar7 = Cudd_addApply(dd,Cudd_addTimes,pDVar13,
                               *(DdNode **)((long)pDVar7 + lVar12 * 8 + -0x10));
        if (pDVar7 == (DdNode *)0x0) goto LAB_0078b2bc;
        piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        Cudd_RecursiveDeref(dd,pDVar13);
        local_98 = (int)local_98 >> 1;
        lVar12 = lVar12 + -1;
        pDVar13 = pDVar7;
      } while (1 < lVar12);
    }
    pDVar7 = cuddUniqueConst(dd,local_48);
    ppDVar9 = local_50;
    if (pDVar7 == (DdNode *)0x0) break;
    piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar2 = *piVar2 + 1;
    local_60 = pDVar7;
    pDVar7 = Cudd_addIte(dd,pDVar13,pDVar7,*local_50);
    if (pDVar7 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar13);
      pDVar13 = local_60;
      break;
    }
    piVar2 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar2 = *piVar2 + 1;
    Cudd_RecursiveDeref(dd,pDVar13);
    Cudd_RecursiveDeref(dd,local_60);
    Cudd_RecursiveDeref(dd,*ppDVar9);
    pFVar14 = local_58;
    *ppDVar9 = pDVar7;
    iVar5 = feof(local_58);
    if (iVar5 != 0) {
      return 1;
    }
  }
LAB_0078b2bc:
  Cudd_RecursiveDeref(dd,pDVar13);
  return 0;
}

Assistant:

int
Cudd_addRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  DdNode *** xn /* array of complemented row variables */,
  DdNode *** yn_ /* array of complemented column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w, *neW;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    CUDD_VALUE_TYPE val;
    DdNode **lx, **ly, **lxn, **lyn;

    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x; lxn = *xn;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *xn = lxn =  ABC_REALLOC(DdNode *, *xn, lnx);
        if (lxn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y; lyn = *yn_;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    /* Here we rely on the fact that REALLOC of a null pointer is
    ** translates to an ALLOC.
    */
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        *yn_ = lyn =  ABC_REALLOC(DdNode *, *yn_, lny);
        if (lyn == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
        do {
            dd->reordered = 0;
            lxn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lxn[i] == NULL) return(0);
        cuddRef(lxn[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
        do {
            dd->reordered = 0;
            lyn[i] = cuddUniqueInter(dd, nv, zero, one);
        } while (dd->reordered == 1);
        if (lyn[i] == NULL) return(0);
        cuddRef(lyn[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = dd->background; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d %lf", &u, &v, &val);
        if (err == EOF) {
            break;
        } else if (err != 3) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lx[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lxn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, ly[i]);
            } else {
                w = Cudd_addApply(dd, Cudd_addTimes, minterm1, lyn[i]);
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }
        /* Create new constant node if necessary.
        ** This call will never cause reordering.
        */
        neW = cuddUniqueConst(dd, val);
        if (neW == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        cuddRef(neW);

        w = Cudd_addIte(dd, minterm1, neW, *E);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            Cudd_RecursiveDeref(dd, neW);
            return(0);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, neW);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}